

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O2

int xmlInitMemory(void)

{
  char *pcVar1;
  int iVar2;
  
  if (xmlMemInitialized == '\0') {
    xmlMemInitialized = '\x01';
    xmlMemMutex = xmlNewMutex();
    pcVar1 = getenv("XML_MEM_BREAKPOINT");
    if (pcVar1 != (char *)0x0) {
      __isoc99_sscanf(pcVar1,"%ud",&xmlMemStopAtBlock);
    }
    pcVar1 = getenv("XML_MEM_TRACE");
    if (pcVar1 == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      __isoc99_sscanf(pcVar1,"%p",&xmlMemTraceBlockAt);
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
xmlInitMemory(void)
{
     char *breakpoint;
#ifdef DEBUG_MEMORY
     xmlGenericError(xmlGenericErrorContext,
	     "xmlInitMemory()\n");
#endif
    /*
     This is really not good code (see Bug 130419).  Suggestions for
     improvement will be welcome!
    */
     if (xmlMemInitialized) return(-1);
     xmlMemInitialized = 1;
     xmlMemMutex = xmlNewMutex();

     breakpoint = getenv("XML_MEM_BREAKPOINT");
     if (breakpoint != NULL) {
         sscanf(breakpoint, "%ud", &xmlMemStopAtBlock);
     }
     breakpoint = getenv("XML_MEM_TRACE");
     if (breakpoint != NULL) {
         sscanf(breakpoint, "%p", &xmlMemTraceBlockAt);
     }

#ifdef DEBUG_MEMORY
     xmlGenericError(xmlGenericErrorContext,
	     "xmlInitMemory() Ok\n");
#endif
     return(0);
}